

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::AddAllocatedMessage
          (Reflection *this,Message *message,FieldDescriptor *field,Message *new_entry)

{
  byte bVar1;
  uint32_t uVar2;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *this_01;
  Nonnull<const_char_*> pcVar3;
  bool bVar4;
  char *description;
  Descriptor *pDVar5;
  Metadata MVar6;
  
  MVar6 = Message::GetMetadata(message);
  if (MVar6.reflection != this) {
    pDVar5 = this->descriptor_;
    MVar6 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar5,MVar6.descriptor,field,"AddAllocatedMessage");
  }
  pDVar5 = this->descriptor_;
  if (field->containing_type_ == pDVar5) {
    bVar1 = field->field_0x1;
    bVar4 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar4) {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (bVar4,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar3 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) != 0) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
          anon_unknown_6::ReportReflectionUsageTypeError
                    (this->descriptor_,field,"AddAllocatedMessage",CPPTYPE_MESSAGE);
        }
        if ((field->field_0x1 & 8) != 0) {
          uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
          internal::ExtensionSet::AddAllocatedMessage
                    ((ExtensionSet *)
                     ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),field,
                     &new_entry->super_MessageLite);
          return;
        }
        if (field->type_ == '\v') {
          bVar4 = FieldDescriptor::is_map_message_type(field);
          if (bVar4) {
            VerifyFieldType<google::protobuf::internal::MapFieldBase>(this,field);
            this_00 = (MapFieldBase *)MutableRawImpl(this,message,field);
            this_01 = internal::MapFieldBase::MutableRepeatedField(this_00);
            goto LAB_001f8a40;
          }
        }
        VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(this,field);
        this_01 = (RepeatedPtrFieldBase *)MutableRawImpl(this,message,field);
LAB_001f8a40:
        internal::RepeatedPtrFieldBase::
        AddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                  (this_01,new_entry);
        return;
      }
    }
    else {
      AddAllocatedMessage();
    }
    pDVar5 = this->descriptor_;
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar5,field,"AddAllocatedMessage",description);
}

Assistant:

void Reflection::AddAllocatedMessage(Message* message,
                                     const FieldDescriptor* field,
                                     Message* new_entry) const {
  USAGE_MUTABLE_CHECK_ALL(AddAllocatedMessage, REPEATED, MESSAGE);

  if (field->is_extension()) {
    MutableExtensionSet(message)->AddAllocatedMessage(field, new_entry);
  } else {
    RepeatedPtrFieldBase* repeated = nullptr;
    if (IsMapFieldInApi(field)) {
      repeated =
          MutableRaw<MapFieldBase>(message, field)->MutableRepeatedField();
    } else {
      repeated = MutableRaw<RepeatedPtrFieldBase>(message, field);
    }
    repeated->AddAllocated<GenericTypeHandler<Message> >(new_entry);
  }
}